

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

int mbedtls_blowfish_setkey(mbedtls_blowfish_context *ctx,uchar *key,uint keybits)

{
  uint32_t (*pauVar1) [256];
  uint32_t (*pauVar2) [256];
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint32_t *puVar9;
  bool bVar10;
  uint32_t datar;
  uint32_t datal;
  
  if ((keybits & 7) != 0 || 0x1a0 < keybits - 0x20) {
    return -0x16;
  }
  pauVar1 = ctx->S;
  pauVar2 = S;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      (*pauVar1)[lVar5] = (*pauVar2)[lVar5];
    }
    pauVar2 = pauVar2 + 1;
    pauVar1 = pauVar1 + 1;
  }
  uVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x12; lVar3 = lVar3 + 1) {
    uVar6 = 0;
    iVar7 = 4;
    while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
      uVar8 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      uVar6 = uVar6 << 8 | (uint)key[uVar8];
      if (keybits >> 3 <= uVar4) {
        uVar4 = 0;
      }
    }
    ctx->P[lVar3] = uVar6 ^ P[lVar3];
  }
  _datar = 0;
  for (uVar8 = 0; uVar8 < 0x12; uVar8 = uVar8 + 2) {
    blowfish_enc(ctx,&datal,&datar);
    ctx->P[uVar8] = datal;
    ctx->P[uVar8 + 1] = datar;
  }
  puVar9 = ctx->S[0] + 1;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (uVar8 = 0; uVar8 < 0x100; uVar8 = uVar8 + 2) {
      blowfish_enc(ctx,&datal,&datar);
      puVar9[uVar8 - 1] = datal;
      puVar9[uVar8] = datar;
    }
    puVar9 = puVar9 + 0x100;
  }
  return 0;
}

Assistant:

int mbedtls_blowfish_setkey( mbedtls_blowfish_context *ctx, const unsigned char *key,
                     unsigned int keybits )
{
    unsigned int i, j, k;
    uint32_t data, datal, datar;

    if( keybits < MBEDTLS_BLOWFISH_MIN_KEY_BITS || keybits > MBEDTLS_BLOWFISH_MAX_KEY_BITS ||
        ( keybits % 8 ) )
    {
        return( MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH );
    }

    keybits >>= 3;

    for( i = 0; i < 4; i++ )
    {
        for( j = 0; j < 256; j++ )
            ctx->S[i][j] = S[i][j];
    }

    j = 0;
    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS + 2; ++i )
    {
        data = 0x00000000;
        for( k = 0; k < 4; ++k )
        {
            data = ( data << 8 ) | key[j++];
            if( j >= keybits )
                j = 0;
        }
        ctx->P[i] = P[i] ^ data;
    }

    datal = 0x00000000;
    datar = 0x00000000;

    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS + 2; i += 2 )
    {
        blowfish_enc( ctx, &datal, &datar );
        ctx->P[i] = datal;
        ctx->P[i + 1] = datar;
    }

    for( i = 0; i < 4; i++ )
    {
       for( j = 0; j < 256; j += 2 )
       {
            blowfish_enc( ctx, &datal, &datar );
            ctx->S[i][j] = datal;
            ctx->S[i][j + 1] = datar;
        }
    }
    return( 0 );
}